

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# astar.hpp
# Opt level: O3

void __thiscall astar::AStar::LoadMap(AStar *this,Map *map)

{
  int iVar1;
  
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::operator=((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               *)this,&map->map);
  iVar1 = map->n;
  (this->map).m = map->m;
  (this->map).n = iVar1;
  if ((this->openZone).c.
      super__Vector_base<astar::AStar::PointCost,_std::allocator<astar::AStar::PointCost>_>._M_impl.
      super__Vector_impl_data._M_start !=
      (this->openZone).c.
      super__Vector_base<astar::AStar::PointCost,_std::allocator<astar::AStar::PointCost>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    do {
      std::
      priority_queue<astar::AStar::PointCost,_std::vector<astar::AStar::PointCost,_std::allocator<astar::AStar::PointCost>_>,_std::less<astar::AStar::PointCost>_>
      ::pop(&this->openZone);
    } while ((this->openZone).c.
             super__Vector_base<astar::AStar::PointCost,_std::allocator<astar::AStar::PointCost>_>.
             _M_impl.super__Vector_impl_data._M_start !=
             (this->openZone).c.
             super__Vector_base<astar::AStar::PointCost,_std::allocator<astar::AStar::PointCost>_>.
             _M_impl.super__Vector_impl_data._M_finish);
  }
  std::
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_int>,_std::allocator<std::pair<const_unsigned_int,_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::clear(&(this->closeZone)._M_h);
  return;
}

Assistant:

void AStar::LoadMap(const Map& map)
{
    this->map = map;
    while (!openZone.empty()) {
        openZone.pop();
    }
    closeZone.clear();
}